

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O2

int32_t __thiscall
icu_63::Calendar::newestStamp
          (Calendar *this,UCalendarDateFields first,UCalendarDateFields last,int32_t bestStampSoFar)

{
  int32_t bestStamp;
  long lVar1;
  int32_t i;
  
  for (lVar1 = (long)(int)first; lVar1 <= (int)last; lVar1 = lVar1 + 1) {
    if (bestStampSoFar < this->fStamp[lVar1]) {
      bestStampSoFar = this->fStamp[lVar1];
    }
  }
  return bestStampSoFar;
}

Assistant:

int32_t Calendar::newestStamp(UCalendarDateFields first, UCalendarDateFields last, int32_t bestStampSoFar) const
{
    int32_t bestStamp = bestStampSoFar;
    for (int32_t i=(int32_t)first; i<=(int32_t)last; ++i) {
        if (fStamp[i] > bestStamp) {
            bestStamp = fStamp[i];
        }
    }
    return bestStamp;
}